

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
 pybind11::detail::all_type_info_get_cache(PyTypeObject *type)

{
  undefined1 auVar1 [12];
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar2;
  handle local_38;
  handle local_30;
  type local_28;
  
  local_30.m_ptr = (PyObject *)type;
  pVar2 = with_internals<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::detail::internals&)_1_>
                    ((anon_class_8_1_89923c38 *)&local_30);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_28.type = type;
    cpp_function::
    cpp_function<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::handle)_1_,,void>
              ((cpp_function *)&local_38,&local_28);
    weakref::weakref((weakref *)&local_30,(handle)type,local_38);
    local_30.m_ptr = (PyObject *)0x0;
    object::~object((object *)&local_30);
    object::~object((object *)&local_38);
  }
  auVar1 = pVar2._0_12_;
  pVar2._12_4_ = 0;
  pVar2.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )auVar1._0_8_;
  pVar2.second = (bool)auVar1[8];
  pVar2._9_3_ = auVar1._9_3_;
  return pVar2;
}

Assistant:

inline std::pair<decltype(internals::registered_types_py)::iterator, bool>
all_type_info_get_cache(PyTypeObject *type) {
    auto res = with_internals([type](internals &internals) {
        return internals
            .registered_types_py
#ifdef __cpp_lib_unordered_map_try_emplace
            .try_emplace(type);
#else
            .emplace(type, std::vector<detail::type_info *>());
#endif
    });
    if (res.second) {
        // New cache entry created; set up a weak reference to automatically remove it if the type
        // gets destroyed:
        weakref((PyObject *) type, cpp_function([type](handle wr) {
                    with_internals([type](internals &internals) {
                        internals.registered_types_py.erase(type);

                        // TODO consolidate the erasure code in pybind11_meta_dealloc() in class.h
                        auto &cache = internals.inactive_override_cache;
                        for (auto it = cache.begin(), last = cache.end(); it != last;) {
                            if (it->first == reinterpret_cast<PyObject *>(type)) {
                                it = cache.erase(it);
                            } else {
                                ++it;
                            }
                        }
                    });

                    wr.dec_ref();
                }))
            .release();
    }

    return res;
}